

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Am_Drawonable *d)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (d == (Am_Drawonable *)0x0) {
    pcVar2 = "(0L) Drawonable";
  }
  else {
    pcVar2 = d->title;
  }
  std::operator<<(os,pcVar2);
  poVar1 = std::operator<<(os," (");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &
operator<<(std::ostream &os, Am_Drawonable *d)
{
  if (d)
    os << d->Get_Title();
  else
    os << "(0L) Drawonable";
  os << " (" << std::hex << (void *)d << std::dec << ")";
  return os;
}